

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractTestExample.cpp
# Opt level: O1

void __thiscall AbstractTestExample::UpdateDataInfo(AbstractTestExample *this)

{
  int iVar1;
  long *plVar2;
  ostream *poVar3;
  int iVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"postive   ",10);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->positiveN);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"negative  ",10);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->negtiveN);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"imbalance ",10);
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 4;
  poVar3 = std::ostream::_M_insert<double>((double)this->negtiveN / (double)this->positiveN);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  iVar4 = (int)((double)this->instanceN * 0.2);
  this->testN = iVar4;
  this->trainN = this->instanceN - iVar4;
  iVar1 = (int)((double)this->positiveN * 0.2);
  this->posNtest = iVar1;
  this->negNtest = iVar4 - iVar1;
  this->posNtrain = this->positiveN - iVar1;
  this->negNtrain = this->negtiveN - (iVar4 - iVar1);
  return;
}

Assistant:

void AbstractTestExample::UpdateDataInfo()
{
    std::cout<<"postive   "<<positiveN<<std::endl;
    std::cout<<"negative  "<<negtiveN<<std::endl;
    std::cout<<"imbalance "<<std::setprecision(4)<<static_cast<double>(negtiveN)/positiveN<<std::endl;
    
    double testRate=0.2;
    testN=instanceN*testRate;
    trainN=instanceN-testN;
    posNtest=positiveN*testRate;
    negNtest=testN-posNtest;
    posNtrain=positiveN-posNtest;
    negNtrain=negtiveN-negNtest;
}